

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O0

uint64_t sip24_final(siphash *H)

{
  byte bVar1;
  ulong local_20;
  uint64_t b;
  char left;
  siphash *H_local;
  
  bVar1 = ((char)*(undefined4 *)&H->p - (char)H) - 0x20;
  local_20 = (ulong)((int)H->c + (uint)bVar1) << 0x38;
  switch(bVar1) {
  case 7:
    local_20 = (ulong)H->buf[6] << 0x30 | local_20;
  case 6:
    local_20 = (ulong)H->buf[5] << 0x28 | local_20;
  case 5:
    local_20 = (ulong)H->buf[4] << 0x20 | local_20;
  case 4:
    local_20 = (ulong)H->buf[3] << 0x18 | local_20;
  case 3:
    local_20 = (ulong)H->buf[2] << 0x10 | local_20;
  case 2:
    local_20 = (ulong)H->buf[1] << 8 | local_20;
  case 1:
    local_20 = H->buf[0] | local_20;
  case 0:
  default:
    H->v3 = local_20 ^ H->v3;
    sip_round(H,2);
    H->v0 = local_20 ^ H->v0;
    H->v2 = H->v2 ^ 0xff;
    sip_round(H,4);
    return H->v0 ^ H->v1 ^ H->v2 ^ H->v3;
  }
}

Assistant:

static uint64_t
sip24_final(struct siphash *H) {
  const char left = (char)(H->p - H->buf);
  uint64_t b = (H->c + left) << 56;

  switch (left) {
  case 7:
    b |= (uint64_t)H->buf[6] << 48;
    /* fall through */
  case 6:
    b |= (uint64_t)H->buf[5] << 40;
    /* fall through */
  case 5:
    b |= (uint64_t)H->buf[4] << 32;
    /* fall through */
  case 4:
    b |= (uint64_t)H->buf[3] << 24;
    /* fall through */
  case 3:
    b |= (uint64_t)H->buf[2] << 16;
    /* fall through */
  case 2:
    b |= (uint64_t)H->buf[1] << 8;
    /* fall through */
  case 1:
    b |= (uint64_t)H->buf[0] << 0;
    /* fall through */
  case 0:
    break;
  }

  H->v3 ^= b;
  sip_round(H, 2);
  H->v0 ^= b;
  H->v2 ^= 0xff;
  sip_round(H, 4);

  return H->v0 ^ H->v1 ^ H->v2 ^ H->v3;
}